

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O0

void jpeg_simple_progression(j_compress_ptr cinfo)

{
  int ncomps_00;
  long lVar1;
  jpeg_scan_info *pjVar2;
  long *in_RDI;
  jpeg_scan_info *scanptr;
  int nscans;
  int ncomps;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int local_10;
  
  ncomps_00 = *(int *)((long)in_RDI + 0x5c);
  if (*(int *)((long)in_RDI + 0x24) != 100) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x15;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
    (**(code **)*in_RDI)(in_RDI);
  }
  if ((ncomps_00 == 3) && ((int)in_RDI[0xc] == 3)) {
    local_10 = 10;
  }
  else if (ncomps_00 < 5) {
    local_10 = ncomps_00 * 4 + 2;
  }
  else {
    local_10 = ncomps_00 * 6;
  }
  if ((in_RDI[0x47] == 0) || ((int)in_RDI[0x48] < local_10)) {
    in_stack_ffffffffffffffe4 = local_10;
    if (local_10 < 0xb) {
      in_stack_ffffffffffffffe4 = 10;
    }
    *(int *)(in_RDI + 0x48) = in_stack_ffffffffffffffe4;
    lVar1 = (**(code **)in_RDI[1])(in_RDI,0,(long)(int)in_RDI[0x48] * 0x24);
    in_RDI[0x47] = lVar1;
  }
  in_RDI[0x23] = in_RDI[0x47];
  *(int *)(in_RDI + 0x22) = local_10;
  if ((ncomps_00 == 3) && ((int)in_RDI[0xc] == 3)) {
    pjVar2 = fill_dc_scans((jpeg_scan_info *)
                           CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,0);
    pjVar2 = fill_a_scan(pjVar2,0,1,5,0,2);
    pjVar2 = fill_a_scan(pjVar2,2,1,0x3f,0,1);
    pjVar2 = fill_a_scan(pjVar2,1,1,0x3f,0,1);
    pjVar2 = fill_a_scan(pjVar2,0,6,0x3f,0,2);
    fill_a_scan(pjVar2,0,1,0x3f,2,1);
    pjVar2 = fill_dc_scans((jpeg_scan_info *)
                           CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,0);
    pjVar2 = fill_a_scan(pjVar2,2,1,0x3f,1,0);
    pjVar2 = fill_a_scan(pjVar2,1,1,0x3f,1,0);
    fill_a_scan(pjVar2,0,1,0x3f,1,0);
  }
  else {
    pjVar2 = fill_dc_scans((jpeg_scan_info *)
                           CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,0);
    pjVar2 = fill_scans(pjVar2,ncomps_00,1,5,0,2);
    pjVar2 = fill_scans(pjVar2,ncomps_00,6,0x3f,0,2);
    fill_scans(pjVar2,ncomps_00,1,0x3f,2,1);
    pjVar2 = fill_dc_scans((jpeg_scan_info *)
                           CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,0);
    fill_scans(pjVar2,ncomps_00,1,0x3f,1,0);
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_simple_progression (j_compress_ptr cinfo)
{
  int ncomps = cinfo->num_components;
  int nscans;
  jpeg_scan_info * scanptr;

  /* Safety check to ensure start_compress not called yet. */
  if (cinfo->global_state != CSTATE_START)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* Figure space needed for script.  Calculation must match code below! */
  if (ncomps == 3 && cinfo->jpeg_color_space == JCS_YCbCr) {
    /* Custom script for YCbCr color images. */
    nscans = 10;
  } else {
    /* All-purpose script for other color spaces. */
    if (ncomps > MAX_COMPS_IN_SCAN)
      nscans = 6 * ncomps;	/* 2 DC + 4 AC scans per component */
    else
      nscans = 2 + 4 * ncomps;	/* 2 DC scans; 4 AC scans per component */
  }

  /* Allocate space for script.
   * We need to put it in the permanent pool in case the application performs
   * multiple compressions without changing the settings.  To avoid a memory
   * leak if jpeg_simple_progression is called repeatedly for the same JPEG
   * object, we try to re-use previously allocated space, and we allocate
   * enough space to handle YCbCr even if initially asked for grayscale.
   */
  if (cinfo->script_space == NULL || cinfo->script_space_size < nscans) {
    cinfo->script_space_size = MAX(nscans, 10);
    cinfo->script_space = (jpeg_scan_info *)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_PERMANENT,
			cinfo->script_space_size * SIZEOF(jpeg_scan_info));
  }
  scanptr = cinfo->script_space;
  cinfo->scan_info = scanptr;
  cinfo->num_scans = nscans;

  if (ncomps == 3 && cinfo->jpeg_color_space == JCS_YCbCr) {
    /* Custom script for YCbCr color images. */
    /* Initial DC scan */
    scanptr = fill_dc_scans(scanptr, ncomps, 0, 1);
    /* Initial AC scan: get some luma data out in a hurry */
    scanptr = fill_a_scan(scanptr, 0, 1, 5, 0, 2);
    /* Chroma data is too small to be worth expending many scans on */
    scanptr = fill_a_scan(scanptr, 2, 1, 63, 0, 1);
    scanptr = fill_a_scan(scanptr, 1, 1, 63, 0, 1);
    /* Complete spectral selection for luma AC */
    scanptr = fill_a_scan(scanptr, 0, 6, 63, 0, 2);
    /* Refine next bit of luma AC */
    scanptr = fill_a_scan(scanptr, 0, 1, 63, 2, 1);
    /* Finish DC successive approximation */
    scanptr = fill_dc_scans(scanptr, ncomps, 1, 0);
    /* Finish AC successive approximation */
    scanptr = fill_a_scan(scanptr, 2, 1, 63, 1, 0);
    scanptr = fill_a_scan(scanptr, 1, 1, 63, 1, 0);
    /* Luma bottom bit comes last since it's usually largest scan */
    scanptr = fill_a_scan(scanptr, 0, 1, 63, 1, 0);
  } else {
    /* All-purpose script for other color spaces. */
    /* Successive approximation first pass */
    scanptr = fill_dc_scans(scanptr, ncomps, 0, 1);
    scanptr = fill_scans(scanptr, ncomps, 1, 5, 0, 2);
    scanptr = fill_scans(scanptr, ncomps, 6, 63, 0, 2);
    /* Successive approximation second pass */
    scanptr = fill_scans(scanptr, ncomps, 1, 63, 2, 1);
    /* Successive approximation final pass */
    scanptr = fill_dc_scans(scanptr, ncomps, 1, 0);
    scanptr = fill_scans(scanptr, ncomps, 1, 63, 1, 0);
  }
}